

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O0

mbedtls_md_info_t * mbedtls_md_info_from_type(mbedtls_md_type_t md_type)

{
  mbedtls_md_info_t *pmStack_10;
  mbedtls_md_type_t md_type_local;
  
  switch(md_type) {
  case MBEDTLS_MD_MD5:
    pmStack_10 = &mbedtls_md5_info;
    break;
  case MBEDTLS_MD_SHA1:
    pmStack_10 = &mbedtls_sha1_info;
    break;
  case MBEDTLS_MD_SHA224:
    pmStack_10 = &mbedtls_sha224_info;
    break;
  case MBEDTLS_MD_SHA256:
    pmStack_10 = &mbedtls_sha256_info;
    break;
  case MBEDTLS_MD_SHA384:
    pmStack_10 = &mbedtls_sha384_info;
    break;
  case MBEDTLS_MD_SHA512:
    pmStack_10 = &mbedtls_sha512_info;
    break;
  case MBEDTLS_MD_RIPEMD160:
    pmStack_10 = &mbedtls_ripemd160_info;
    break;
  default:
    pmStack_10 = (mbedtls_md_info_t *)0x0;
  }
  return pmStack_10;
}

Assistant:

const mbedtls_md_info_t *mbedtls_md_info_from_type( mbedtls_md_type_t md_type )
{
    switch( md_type )
    {
#if defined(MBEDTLS_MD2_C)
        case MBEDTLS_MD_MD2:
            return( &mbedtls_md2_info );
#endif
#if defined(MBEDTLS_MD4_C)
        case MBEDTLS_MD_MD4:
            return( &mbedtls_md4_info );
#endif
#if defined(MBEDTLS_MD5_C)
        case MBEDTLS_MD_MD5:
            return( &mbedtls_md5_info );
#endif
#if defined(MBEDTLS_RIPEMD160_C)
        case MBEDTLS_MD_RIPEMD160:
            return( &mbedtls_ripemd160_info );
#endif
#if defined(MBEDTLS_SHA1_C)
        case MBEDTLS_MD_SHA1:
            return( &mbedtls_sha1_info );
#endif
#if defined(MBEDTLS_SHA256_C)
        case MBEDTLS_MD_SHA224:
            return( &mbedtls_sha224_info );
        case MBEDTLS_MD_SHA256:
            return( &mbedtls_sha256_info );
#endif
#if defined(MBEDTLS_SHA512_C)
#if !defined(MBEDTLS_SHA512_NO_SHA384)
        case MBEDTLS_MD_SHA384:
            return( &mbedtls_sha384_info );
#endif
        case MBEDTLS_MD_SHA512:
            return( &mbedtls_sha512_info );
#endif
        default:
            return( NULL );
    }
}